

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_nim_has_valid_dims(nifti_image *nim,int complain)

{
  uint local_58;
  uint local_54;
  int errs;
  int c;
  size_t prod;
  int complain_local;
  nifti_image *nim_local;
  
  local_58 = 0;
  if ((nim->dim[0] < 1) || (7 < nim->dim[0])) {
    if (complain != 0) {
      fprintf(_stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",(ulong)(uint)nim->dim[0]);
    }
    nim_local._4_4_ = 0;
  }
  else {
    if (nim->ndim != nim->dim[0]) {
      local_58 = 1;
      if (complain == 0) {
        return 0;
      }
      fprintf(_stderr,"** NVd: ndim != dim[0] (%d,%d)\n",(ulong)(uint)nim->ndim,
              (ulong)(uint)nim->dim[0]);
    }
    if ((((((0 < nim->dim[0]) && (nim->dim[1] != nim->nx)) ||
          ((1 < nim->dim[0] && (nim->dim[2] != nim->ny)))) ||
         ((2 < nim->dim[0] && (nim->dim[3] != nim->nz)))) ||
        ((3 < nim->dim[0] && (nim->dim[4] != nim->nt)))) ||
       ((((4 < nim->dim[0] && (nim->dim[5] != nim->nu)) ||
         ((5 < nim->dim[0] && (nim->dim[6] != nim->nv)))) ||
        ((6 < nim->dim[0] && (nim->dim[7] != nim->nw)))))) {
      local_58 = local_58 + 1;
      if (complain == 0) {
        return 0;
      }
      fprintf(_stderr,
              "** NVd mismatch: dims    = %d,%d,%d,%d,%d,%d,%d\n                 nxyz... = %d,%d,%d,%d,%d,%d,%d\n"
              ,(ulong)(uint)nim->dim[1],(ulong)(uint)nim->dim[2],(ulong)(uint)nim->dim[3],
              (ulong)(uint)nim->dim[4],nim->dim[5],nim->dim[6],nim->dim[7],nim->nx,nim->ny,nim->nz,
              nim->nt,nim->nu,nim->nv,nim->nw);
    }
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d check dim[%d] =",(ulong)(uint)nim->dim[0]);
      for (local_54 = 0; (int)local_54 < 7; local_54 = local_54 + 1) {
        fprintf(_stderr," %d",(ulong)(uint)nim->dim[(int)local_54]);
      }
      fputc(10,_stderr);
    }
    _errs = 1;
    for (local_54 = 1; (int)local_54 <= nim->dim[0]; local_54 = local_54 + 1) {
      if (nim->dim[(int)local_54] < 1) {
        if (nim->dim[(int)local_54] < 1) {
          if (complain == 0) {
            return 0;
          }
          fprintf(_stderr,"** NVd: dim[%d] (=%d) <= 0\n",(ulong)local_54,
                  (ulong)(uint)nim->dim[(int)local_54]);
          local_58 = local_58 + 1;
        }
      }
      else {
        _errs = (long)nim->dim[(int)local_54] * _errs;
      }
    }
    if (_errs != nim->nvox) {
      if (complain == 0) {
        return 0;
      }
      fprintf(_stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",
              (ulong)(uint)nim->dim[0],nim->nvox & 0xffffffff,_errs & 0xffffffff);
      local_58 = local_58 + 1;
    }
    if (1 < g_opts.debug) {
      local_54 = nim->dim[0];
      while (local_54 = local_54 + 1, (int)local_54 < 8) {
        if ((nim->dim[(int)local_54] != 0) && (nim->dim[(int)local_54] != 1)) {
          fprintf(_stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",(ulong)local_54,
                  (ulong)(uint)nim->dim[(int)local_54],(ulong)(uint)nim->dim[0]);
        }
      }
    }
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d nim_has_valid_dims check, errs = %d\n",(ulong)local_58);
    }
    if ((int)local_58 < 1) {
      nim_local._4_4_ = 1;
    }
    else {
      nim_local._4_4_ = 0;
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_nim_has_valid_dims(nifti_image * nim, int complain)
{
   size_t prod;
   int    c, errs = 0;

   /**- start with dim[0]: failure here is considered terminal */
   if( nim->dim[0] <= 0 || nim->dim[0] > 7 ){
      errs++;
      if( complain )
         fprintf(stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",nim->dim[0]);
      return 0;
   }

   /**- check whether ndim equals dim[0] */
   if( nim->ndim != nim->dim[0] ){
      errs++;
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: ndim != dim[0] (%d,%d)\n",nim->ndim,nim->dim[0]);
   }

   /**- compare each dim[i] to the proper nx, ny, ... */
   if( ( (nim->dim[0] >= 1) && (nim->dim[1] != nim->nx) ) ||
       ( (nim->dim[0] >= 2) && (nim->dim[2] != nim->ny) ) ||
       ( (nim->dim[0] >= 3) && (nim->dim[3] != nim->nz) ) ||
       ( (nim->dim[0] >= 4) && (nim->dim[4] != nim->nt) ) ||
       ( (nim->dim[0] >= 5) && (nim->dim[5] != nim->nu) ) ||
       ( (nim->dim[0] >= 6) && (nim->dim[6] != nim->nv) ) ||
       ( (nim->dim[0] >= 7) && (nim->dim[7] != nim->nw) )   ){
      errs++;
      if( !complain ) return 0;
      fprintf(stderr,"** NVd mismatch: dims    = %d,%d,%d,%d,%d,%d,%d\n"
                     "                 nxyz... = %d,%d,%d,%d,%d,%d,%d\n",
                     nim->dim[1], nim->dim[2], nim->dim[3],
                     nim->dim[4], nim->dim[5], nim->dim[6], nim->dim[7],
                     nim->nx, nim->ny, nim->nz,
                     nim->nt, nim->nu, nim->nv, nim->nw );
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d check dim[%d] =", nim->dim[0]);
      for( c = 0; c < 7; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /**- check the dimensions, and that their product matches nvox */
   prod = 1;
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( nim->dim[c] > 0)
         prod *= nim->dim[c];
      else if( nim->dim[c] <= 0 ){
         if( !complain ) return 0;
         fprintf(stderr,"** NVd: dim[%d] (=%d) <= 0\n",c, nim->dim[c]);
         errs++;
      }
   }
   if( prod != nim->nvox ){
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",
              nim->dim[0], (unsigned)nim->nvox, (unsigned)prod);
      errs++;
   }

   /**- if debug, warn about any remaining dim that is neither 0, nor 1 */
   /*   (values in dims above dim[0] are undefined, as reminded by Cinly
         Ooi and Alle Meije Wink)                   16 Nov 2005 [rickr] */
   if( g_opts.debug > 1 )
      for( c = nim->dim[0]+1; c <= 7; c++ )
         if( nim->dim[c] != 0 && nim->dim[c] != 1 )
            fprintf(stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",
                    c, nim->dim[c], nim->dim[0]);

   if( g_opts.debug > 2 )
      fprintf(stderr,"-d nim_has_valid_dims check, errs = %d\n", errs);

   /**- return invalid or valid */
   if( errs > 0 ) return 0;
   else           return 1;
}